

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HumanPlayer.cpp
# Opt level: O3

Card * __thiscall
HumanPlayer::makeDecision
          (HumanPlayer *this,vector<Card_*,_std::allocator<Card_*>_> *available_cards)

{
  pointer ppCVar1;
  Card *c;
  ostream *poVar2;
  long *plVar3;
  vector<Card_*,_std::allocator<Card_*>_> *__range1;
  pointer ppCVar4;
  int iVar5;
  int card_no;
  Cursor local_44;
  Erase local_38;
  
  AdvancedConsole::Cursor::Cursor(&local_44,8,0,AC_ABSOLUTE);
  poVar2 = AdvancedConsole::operator<<((ostream *)&std::cout,&local_44);
  AdvancedConsole::Erase::Erase(&local_38,AC_ALL,AC_LINE);
  poVar2 = AdvancedConsole::operator<<(poVar2,&local_38);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"It\'s Player ",0xc);
  poVar2 = operator<<(poVar2,&this->super_Player);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\'s turn.",8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  Player::displayHand(&this->super_Player,9);
  AdvancedConsole::Erase::Erase((Erase *)&local_44,AC_AFTER,AC_SCREEN);
  poVar2 = AdvancedConsole::operator<<((ostream *)&std::cout,(Erase *)&local_44);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Playable Cards: ",0x10);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  local_44.r = 0xffffffff;
  ppCVar1 = (available_cards->super__Vector_base<Card_*,_std::allocator<Card_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  iVar5 = 0;
  for (ppCVar4 = (available_cards->super__Vector_base<Card_*,_std::allocator<Card_*>_>)._M_impl.
                 super__Vector_impl_data._M_start; ppCVar4 != ppCVar1; ppCVar4 = ppCVar4 + 1) {
    c = *ppCVar4;
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,":",1);
    poVar2 = operator<<(poVar2,c);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    iVar5 = iVar5 + 1;
  }
  do {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Play: ",6);
    plVar3 = (long *)std::istream::operator>>((istream *)&std::cin,&local_44.r);
    if (-1 < local_44.r && (*(byte *)((long)plVar3 + *(long *)(*plVar3 + -0x18) + 0x20) & 5) == 0) {
      ppCVar4 = (available_cards->super__Vector_base<Card_*,_std::allocator<Card_*>_>)._M_impl.
                super__Vector_impl_data._M_start;
      if ((ulong)(uint)local_44.r <
          (ulong)((long)(available_cards->super__Vector_base<Card_*,_std::allocator<Card_*>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)ppCVar4 >> 3)) {
        return ppCVar4[(uint)local_44.r];
      }
    }
    if (((&std::exception::typeinfo)[*(long *)(std::cin + -0x18)] & 5) != 0) {
      std::ios::clear((int)*(long *)(std::cin + -0x18) + 0x1232e0);
      std::istream::ignore();
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Incorrect entry. Try again: ",0x1c);
  } while( true );
}

Assistant:

Card *HumanPlayer::makeDecision(std::vector<Card *> available_cards) {
    cout << AdvancedConsole::Cursor(8, 0) << AdvancedConsole::Erase(AdvancedConsole::AC_ALL, AdvancedConsole::AC_LINE)
         << "It's Player " << *this << "'s turn." << endl;

    displayHand(9);

    cout << AdvancedConsole::Erase(AdvancedConsole::AC_AFTER) << "Playable Cards: " << endl;
    int i = 0, card_no = -1;
    for (Card *c: available_cards) {
        cout << i++ << ":" << *c << endl;
    }

    while (true) {
        cout << "Play: ";
        if (cin >> card_no && card_no >= 0 && card_no < available_cards.size()) {
            break;
        } else if (cin.fail()) {
            cin.clear();
            cin.ignore();
        }
        cout << "Incorrect entry. Try again: ";
    }

    Card *card = available_cards[card_no];
    return card;
}